

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_gen_impl.h
# Opt level: O0

void secp256k1_ecmult_gen_blind(secp256k1_ecmult_gen_context *ctx,uchar *seed32)

{
  int iVar1;
  uint uVar2;
  uchar local_198 [8];
  uchar keydata [64];
  undefined1 local_14c [4];
  int overflow;
  secp256k1_rfc6979_hmac_sha256 rng;
  uchar nonce32 [32];
  undefined1 local_e0 [8];
  secp256k1_fe s;
  secp256k1_gej gb;
  secp256k1_scalar b;
  uchar *seed32_local;
  secp256k1_ecmult_gen_context *ctx_local;
  
  memset(local_198,0,0x40);
  if (seed32 == (uchar *)0x0) {
    secp256k1_gej_set_ge(&ctx->initial,&secp256k1_ge_const_g);
    secp256k1_gej_neg(&ctx->initial,&ctx->initial);
    secp256k1_scalar_set_int(&ctx->blind,1);
  }
  secp256k1_scalar_get_b32(rng.k + 0x1c,&ctx->blind);
  local_198 = (uchar  [8])rng._60_8_;
  if (seed32 != (uchar *)0x0) {
    keydata._24_8_ = *(undefined8 *)seed32;
    keydata._32_8_ = *(undefined8 *)(seed32 + 8);
    keydata._40_8_ = *(undefined8 *)(seed32 + 0x10);
    keydata._48_8_ = *(undefined8 *)(seed32 + 0x18);
  }
  iVar1 = 0x20;
  if (seed32 != (uchar *)0x0) {
    iVar1 = 0x40;
  }
  secp256k1_rfc6979_hmac_sha256_initialize
            ((secp256k1_rfc6979_hmac_sha256 *)local_14c,local_198,(long)iVar1);
  memset(local_198,0,0x40);
  secp256k1_rfc6979_hmac_sha256_generate
            ((secp256k1_rfc6979_hmac_sha256 *)local_14c,rng.k + 0x1c,0x20);
  iVar1 = secp256k1_fe_set_b32((secp256k1_fe *)local_e0,rng.k + 0x1c);
  uVar2 = secp256k1_fe_is_zero((secp256k1_fe *)local_e0);
  secp256k1_fe_cmov((secp256k1_fe *)local_e0,&secp256k1_fe_one,uVar2 | (iVar1 != 0 ^ 0xffU) & 1);
  secp256k1_gej_rescale(&ctx->initial,(secp256k1_fe *)local_e0);
  secp256k1_fe_clear((secp256k1_fe *)local_e0);
  secp256k1_rfc6979_hmac_sha256_generate
            ((secp256k1_rfc6979_hmac_sha256 *)local_14c,rng.k + 0x1c,0x20);
  secp256k1_scalar_set_b32((secp256k1_scalar *)&gb.infinity,rng.k + 0x1c,(int *)0x0);
  iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)&gb.infinity);
  secp256k1_scalar_cmov((secp256k1_scalar *)&gb.infinity,&secp256k1_scalar_one,iVar1);
  secp256k1_rfc6979_hmac_sha256_finalize((secp256k1_rfc6979_hmac_sha256 *)local_14c);
  memset(rng.k + 0x1c,0,0x20);
  secp256k1_ecmult_gen(ctx,(secp256k1_gej *)(s.n + 4),(secp256k1_scalar *)&gb.infinity);
  secp256k1_scalar_negate((secp256k1_scalar *)&gb.infinity,(secp256k1_scalar *)&gb.infinity);
  (ctx->blind).d[0] = gb._120_8_;
  (ctx->blind).d[1] = b.d[0];
  (ctx->blind).d[2] = b.d[1];
  (ctx->blind).d[3] = b.d[2];
  memcpy(&ctx->initial,s.n + 4,0x80);
  secp256k1_scalar_clear((secp256k1_scalar *)&gb.infinity);
  secp256k1_gej_clear((secp256k1_gej *)(s.n + 4));
  return;
}

Assistant:

static void secp256k1_ecmult_gen_blind(secp256k1_ecmult_gen_context *ctx, const unsigned char *seed32) {
    secp256k1_scalar b;
    secp256k1_gej gb;
    secp256k1_fe s;
    unsigned char nonce32[32];
    secp256k1_rfc6979_hmac_sha256 rng;
    int overflow;
    unsigned char keydata[64] = {0};
    if (seed32 == NULL) {
        /* When seed is NULL, reset the initial point and blinding value. */
        secp256k1_gej_set_ge(&ctx->initial, &secp256k1_ge_const_g);
        secp256k1_gej_neg(&ctx->initial, &ctx->initial);
        secp256k1_scalar_set_int(&ctx->blind, 1);
    }
    /* The prior blinding value (if not reset) is chained forward by including it in the hash. */
    secp256k1_scalar_get_b32(nonce32, &ctx->blind);
    /** Using a CSPRNG allows a failure free interface, avoids needing large amounts of random data,
     *   and guards against weak or adversarial seeds.  This is a simpler and safer interface than
     *   asking the caller for blinding values directly and expecting them to retry on failure.
     */
    memcpy(keydata, nonce32, 32);
    if (seed32 != NULL) {
        memcpy(keydata + 32, seed32, 32);
    }
    secp256k1_rfc6979_hmac_sha256_initialize(&rng, keydata, seed32 ? 64 : 32);
    memset(keydata, 0, sizeof(keydata));
    /* Accept unobservably small non-uniformity. */
    secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
    overflow = !secp256k1_fe_set_b32(&s, nonce32);
    overflow |= secp256k1_fe_is_zero(&s);
    secp256k1_fe_cmov(&s, &secp256k1_fe_one, overflow);
    /* Randomize the projection to defend against multiplier sidechannels. */
    secp256k1_gej_rescale(&ctx->initial, &s);
    secp256k1_fe_clear(&s);
    secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
    secp256k1_scalar_set_b32(&b, nonce32, NULL);
    /* A blinding value of 0 works, but would undermine the projection hardening. */
    secp256k1_scalar_cmov(&b, &secp256k1_scalar_one, secp256k1_scalar_is_zero(&b));
    secp256k1_rfc6979_hmac_sha256_finalize(&rng);
    memset(nonce32, 0, 32);
    secp256k1_ecmult_gen(ctx, &gb, &b);
    secp256k1_scalar_negate(&b, &b);
    ctx->blind = b;
    ctx->initial = gb;
    secp256k1_scalar_clear(&b);
    secp256k1_gej_clear(&gb);
}